

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contexts.h
# Opt level: O3

Result<wasm::WATParser::TypeUse> * __thiscall
wasm::WATParser::ParseModuleTypesCtx::makeTypeUse
          (Result<wasm::WATParser::TypeUse> *__return_storage_ptr__,ParseModuleTypesCtx *this,
          Index pos,
          optional<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT>
          type,ParamsT *params,ResultsT *results)

{
  pointer pNVar1;
  char *pcVar2;
  const_iterator cVar3;
  NameType *p;
  pointer __args;
  HeapType local_70;
  vector<wasm::Name,_std::allocator<wasm::Name>_> local_68;
  Index local_4c;
  undefined1 auStack_48 [4];
  Index pos_local;
  vector<wasm::Name,_std::allocator<wasm::Name>_> ids;
  
  _auStack_48 = (pointer)0x0;
  ids.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  ids.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_4c = pos;
  if (params != (ParamsT *)0x0) {
    std::vector<wasm::Name,_std::allocator<wasm::Name>_>::reserve
              ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)auStack_48,
               ((long)(params->super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>).
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)(params->super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>).
                      _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
    __args = (params->super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pNVar1 = (params->super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (__args != pNVar1) {
      do {
        if (ids.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
            super__Vector_impl_data._M_start ==
            ids.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          std::vector<wasm::Name,std::allocator<wasm::Name>>::_M_realloc_insert<wasm::Name_const&>
                    ((vector<wasm::Name,std::allocator<wasm::Name>> *)auStack_48,
                     (iterator)
                     ids.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                     super__Vector_impl_data._M_start,&__args->name);
        }
        else {
          pcVar2 = (__args->name).super_IString.str._M_str;
          ((ids.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
            super__Vector_impl_data._M_start)->super_IString).str._M_len =
               (__args->name).super_IString.str._M_len;
          ((ids.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
            super__Vector_impl_data._M_start)->super_IString).str._M_str = pcVar2;
          ids.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
          super__Vector_impl_data._M_start =
               ids.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
               super__Vector_impl_data._M_start + 1;
        }
        __args = __args + 1;
      } while (__args != pNVar1);
    }
  }
  if (type.
      super__Optional_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_true,_true>
      ._M_payload.
      super__Optional_payload_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT>
      ._M_engaged == true) {
    local_70.id = (uintptr_t)
                  type.
                  super__Optional_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_true,_true>
                  ._M_payload.
                  super__Optional_payload_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT>
                  ._M_payload._M_value.type.id;
    std::vector<wasm::Name,_std::allocator<wasm::Name>_>::vector
              (&local_68,(vector<wasm::Name,_std::allocator<wasm::Name>_> *)auStack_48);
  }
  else {
    cVar3 = std::
            _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::HeapType>,_std::allocator<std::pair<const_unsigned_int,_wasm::HeapType>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&this->implicitTypes->_M_h,&local_4c);
    if (cVar3.super__Node_iterator_base<std::pair<const_unsigned_int,_wasm::HeapType>,_false>._M_cur
        == (__node_type *)0x0) {
      __assert_fail("it != implicitTypes.end()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/parser/contexts.h"
                    ,0x527,
                    "Result<TypeUseT> wasm::WATParser::ParseModuleTypesCtx::makeTypeUse(Index, std::optional<HeapTypeT>, ParamsT *, ResultsT *)"
                   );
    }
    local_70.id = *(uintptr_t *)
                   ((long)cVar3.
                          super__Node_iterator_base<std::pair<const_unsigned_int,_wasm::HeapType>,_false>
                          ._M_cur + 0x10);
    std::vector<wasm::Name,_std::allocator<wasm::Name>_>::vector
              (&local_68,(vector<wasm::Name,_std::allocator<wasm::Name>_> *)auStack_48);
  }
  *(uintptr_t *)
   &(__return_storage_ptr__->val).super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
    super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
    super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
    super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
    super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
    super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err> = local_70.id;
  *(pointer *)
   ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
           super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
           super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
           super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
           super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
           super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err> + 8) =
       local_68.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
       super__Vector_impl_data._M_start;
  *(pointer *)
   ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
           super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
           super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
           super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
           super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
           super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err> + 0x10) =
       local_68.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
       super__Vector_impl_data._M_finish;
  *(pointer *)
   ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
           super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
           super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
           super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
           super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
           super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err> + 0x18) =
       local_68.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  *(__index_type *)
   ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
           super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
           super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
           super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
           super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
           super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err> + 0x20) = '\0';
  if (_auStack_48 != (pointer)0x0) {
    operator_delete(_auStack_48,
                    (long)ids.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)_auStack_48);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<TypeUseT> makeTypeUse(Index pos,
                               std::optional<HeapTypeT> type,
                               ParamsT* params,
                               ResultsT* results) {
    std::vector<Name> ids;
    if (params) {
      ids.reserve(params->size());
      for (auto& p : *params) {
        ids.push_back(p.name);
      }
    }

    if (type) {
      return TypeUse{*type, ids};
    }

    auto it = implicitTypes.find(pos);
    assert(it != implicitTypes.end());

    return TypeUse{it->second, ids};
  }